

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::evaluateFeatureFile(QMakeEvaluator *this,QString *fileName,bool silent)

{
  byte bVar1;
  ProFile *pPVar2;
  QMakeFeatureRoots *pQVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char cVar6;
  bool bVar7;
  FileType FVar8;
  VisitReturn VVar9;
  QList<ProString> *this_00;
  long lVar10;
  long lVar11;
  uchar *this_01;
  long lVar12;
  qsizetype *pqVar13;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QByteArrayView QVar16;
  QAnyStringView QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  ProString afn;
  QArrayData *local_d0 [3];
  undefined1 local_b8 [32];
  char16_t *local_98;
  undefined1 *puStack_90;
  QString local_88;
  QString local_68;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (fileName->d).d;
  local_68.d.ptr = (fileName->d).ptr;
  local_68.d.size = (fileName->d).size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar14.m_data = (char *)0x4;
  QVar14.m_size = (qsizetype)&local_68;
  cVar6 = QString::endsWith(QVar14,0x2b732f);
  if (cVar6 == '\0') {
    QVar15.m_data = (char *)0x4;
    QVar15.m_size = (qsizetype)&local_68;
    QString::append(QVar15);
  }
  if ((this->m_featureRoots).d.ptr == (QMakeFeatureRoots *)0x0) {
    updateFeaturePaths(this);
  }
  lVar12 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if ((lVar12 == 0) ||
     (pPVar2 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar12 + -1],
     pPVar2 == (ProFile *)0x0)) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
  }
  else {
    local_88.d.d = (pPVar2->m_fileName).d.d;
    local_88.d.ptr = (pPVar2->m_fileName).d.ptr;
    local_88.d.size = (pPVar2->m_fileName).d.size;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar21 = QMakeInternal::IoUtils::fileName(&local_88);
  QVar22 = QMakeInternal::IoUtils::fileName(&local_68);
  if (QVar21.m_size == QVar22.m_size) {
    QVar22.m_data = QVar22.m_data;
    QVar22.m_size = QVar21.m_size;
    cVar6 = QtPrivate::equalStrings(QVar21,QVar22);
    if (cVar6 == '\0') goto LAB_00283a7f;
  }
  else {
LAB_00283a7f:
    pDVar5 = local_88.d.d;
    if (local_88.d.ptr != (char16_t *)0x0) {
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
        }
      }
    }
  }
  pQVar3 = (this->m_featureRoots).d.ptr;
  local_b8._0_8_ = local_68.d.d;
  local_b8._8_8_ = local_68.d.ptr;
  local_b8._16_8_ = local_68.d.size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._24_8_ = local_88.d.d;
  local_98 = local_88.d.ptr;
  puStack_90 = (undefined1 *)local_88.d.size;
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<std::pair<QString,QString>,QString>::tryEmplace_impl<std::pair<QString,QString>const&>
            (&local_50,&pQVar3->cache,(pair<QString,_QString> *)local_b8);
  pEVar4 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  bVar1 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
          [(uint)local_50.iterator.i.bucket & 0x7f];
  if ((QArrayData *)local_b8._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._24_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  this_01 = pEVar4[bVar1].storage.data + 0x30;
  if (*(long *)(pEVar4[bVar1].storage.data + 0x38) != 0) {
    QString::operator=(&local_68,(QString *)this_01);
    goto LAB_00283d46;
  }
  pQVar3 = (this->m_featureRoots).d.ptr;
  if ((undefined1 *)local_88.d.size == (undefined1 *)0x0) {
    lVar12 = (pQVar3->paths).d.size;
    lVar10 = 0;
LAB_00283c5d:
    if (lVar10 < lVar12) goto LAB_00283c66;
  }
  else {
    QVar21 = QMakeInternal::IoUtils::pathName(&local_88);
    lVar12 = (pQVar3->paths).d.size;
    if (lVar12 != 0) {
      pqVar13 = &(((pQVar3->paths).d.ptr)->d).size;
      lVar10 = 0x100000000;
      lVar11 = lVar12;
      do {
        if (QVar21.m_size == *pqVar13) {
          QVar20.m_data = (char16_t *)pqVar13[-1];
          QVar20.m_size = QVar21.m_size;
          cVar6 = QtPrivate::equalStrings(QVar21,QVar20);
          if (cVar6 != '\0') {
            lVar10 = lVar10 >> 0x20;
            goto LAB_00283c5d;
          }
        }
        lVar10 = lVar10 + 0x100000000;
        pqVar13 = pqVar13 + 3;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
      lVar10 = 0;
LAB_00283c66:
      lVar12 = lVar10 * 0x18;
      do {
        local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_50.iterator.i.d =
             (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)
             ((long)&(((pQVar3->paths).d.ptr)->d).d + lVar12);
        local_50.iterator.i.bucket = (size_t)&local_68;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_b8,(QStringBuilder<const_QString_&,_QString_&> *)&local_50);
        FVar8 = QMakeInternal::IoUtils::fileType((QString *)local_b8);
        if (FVar8 != FileNotFound) {
          QString::operator=(&local_68,(QString *)local_b8);
        }
        if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        if (FVar8 != FileNotFound) goto LAB_00283d2a;
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 0x18;
      } while (lVar10 < (pQVar3->paths).d.size);
    }
  }
  QString::operator=(&local_68,(QLatin1String)(ZEXT816(0x2abcf1) << 0x40));
LAB_00283d2a:
  QString::operator=((QString *)this_01,(QString *)&local_68);
LAB_00283d46:
  if ((undefined1 *)local_68.d.size == (undefined1 *)0x0) {
    VVar9 = ReturnFalse;
    if (!silent) {
      QVar18.m_data = (storage_type *)0x16;
      QVar18.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar18);
      QVar19.m_size = (size_t)&local_50;
      QVar19.field_0.m_data = local_b8;
      QString::arg_impl(QVar19,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
      message(this,0x310,(QString *)local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (local_50.iterator.i.d !=
          (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) {
        LOCK();
        ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
        }
      }
      VVar9 = ReturnFalse;
    }
  }
  else {
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_INTERNAL_INCLUDED_FEATURES");
    this_00 = &valuesRef(this,(ProKey *)local_b8)->super_QList<ProString>;
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
    local_98 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_b8,&local_68);
    VVar9 = ReturnTrue;
    bVar7 = ProStringList::contains((ProStringList *)this_00,(ProString *)local_b8,CaseSensitive);
    if (bVar7) {
      if (!silent) {
        QVar16.m_data = (storage_type *)0x1b;
        QVar16.m_size = (qsizetype)local_d0;
        QString::fromLatin1(QVar16);
        QVar17.m_size = (size_t)local_d0;
        QVar17.field_0.m_data = &local_50;
        QString::arg_impl(QVar17,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
        message(this,0x210,(QString *)&local_50);
        if (local_50.iterator.i.d !=
            (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) {
          LOCK();
          ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
               ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
          }
        }
        if (local_d0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d0[0],2,0x10);
          }
        }
      }
    }
    else {
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_b8);
      QList<ProString>::end(this_00);
      VVar9 = evaluateFile(this,&local_68,EvalFeatureFile,(LoadFlags)0x0);
    }
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar9;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFeatureFile(
        const QString &fileName, bool silent)
{
    QString fn = fileName;
    if (!fn.endsWith(QLatin1String(".prf")))
        fn += QLatin1String(".prf");

    if (!m_featureRoots)
        updateFeaturePaths();
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.lock();
#endif
    QString currFn = currentFileName();
    if (IoUtils::fileName(currFn) != IoUtils::fileName(fn))
        currFn.clear();
    // Null values cannot regularly exist in the hash, so they indicate that the value still
    // needs to be determined. Failed lookups are represented via non-null empty strings.
    QString *fnp = &m_featureRoots->cache[qMakePair(fn, currFn)];
    if (fnp->isNull()) {
#ifdef QMAKE_OVERRIDE_PRFS
        {
            QString ovrfn(QLatin1String(":/qmake/override_features/") + fn);
            if (QFileInfo::exists(ovrfn)) {
                fn = ovrfn;
                goto cool;
            }
        }
#endif
        {
            int start_root = 0;
            const QStringList &paths = m_featureRoots->paths;
            if (!currFn.isEmpty()) {
                QStringView currPath = IoUtils::pathName(currFn);
                for (int root = 0; root < paths.size(); ++root)
                    if (currPath == paths.at(root)) {
                        start_root = root + 1;
                        break;
                    }
            }
            for (int root = start_root; root < paths.size(); ++root) {
                QString fname = paths.at(root) + fn;
                if (IoUtils::exists(fname)) {
                    fn = fname;
                    goto cool;
                }
            }
        }
#ifdef QMAKE_BUILTIN_PRFS
        fn.prepend(QLatin1String(":/qmake/features/"));
        if (QFileInfo::exists(fn))
            goto cool;
#endif
        fn = QLatin1String(""); // Indicate failed lookup. See comment above.

      cool:
        *fnp = fn;
    } else {
        fn = *fnp;
    }
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.unlock();
#endif
    if (fn.isEmpty()) {
        if (!silent)
            evalError(fL1S("Cannot find feature %1").arg(fileName));
        return ReturnFalse;
    }
    ProStringList &already = valuesRef(ProKey("QMAKE_INTERNAL_INCLUDED_FEATURES"));
    ProString afn(fn);
    if (already.contains(afn)) {
        if (!silent)
            languageWarning(fL1S("Feature %1 already included").arg(fileName));
        return ReturnTrue;
    }
    already.append(afn);

#ifdef PROEVALUATOR_CUMULATIVE
    bool cumulative = m_cumulative;
    // Even when evaluating the project in cumulative mode to maximize the
    // chance of collecting all source declarations, prfs are evaluated in
    // exact mode to maximize the chance of them successfully executing
    // their programmatic function.
    m_cumulative = false;
#endif

    // The path is fully normalized already.
    VisitReturn ok = evaluateFile(fn, QMakeHandler::EvalFeatureFile, LoadProOnly);

#ifdef PROEVALUATOR_CUMULATIVE
    m_cumulative = cumulative;
    if (cumulative) {
        // As the data collected in cumulative mode is potentially total
        // garbage, yet the prfs fed with it are executed in exact mode,
        // we must ignore their results to avoid that evaluation is unduly
        // aborted.
        ok = ReturnTrue;
    }
#endif
    return ok;
}